

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

int runsiz(runsdef *item)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = item->runstyp;
  if (0xd < bVar1) {
    return 0;
  }
  if ((0x2404U >> (bVar1 & 0x1f) & 1) == 0) {
    if ((0x88U >> (bVar1 & 0x1f) & 1) != 0) {
      return (int)*(ushort *)(item->runsv).runsvstr;
    }
    if (bVar1 != 1) {
      return 0;
    }
    iVar2 = 4;
  }
  else {
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int runsiz(runsdef *item)
{
    switch(item->runstyp)
    {
    case DAT_NUMBER:
        return(4);
    case DAT_SSTRING:
    case DAT_LIST:
        return(osrp2(item->runsv.runsvstr));
    case DAT_PROPNUM:
    case DAT_OBJECT:
    case DAT_FNADDR:
        return(2);
    default:
        return(0);
    }
}